

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateVirtualFunctionSet
          (ExpressionContext *ctx,SynBase *source,ExprBase *value,InplaceStr name,TypeClass *parent)

{
  FunctionData *pFVar1;
  TypeFunction *pTVar2;
  uint hash;
  int iVar3;
  Node *pNVar4;
  undefined4 extraout_var;
  Node *pNVar6;
  TypeFunctionSet *pTVar7;
  ExprBase *pEVar8;
  ulong uVar9;
  Node *pNVar10;
  NodeIterator NVar11;
  ArrayView<TypeBase_*> setTypes;
  IntrusiveList<FunctionHandle> functions;
  SmallArray<TypeBase_*,_16U> types;
  IntrusiveList<FunctionHandle> local_d8;
  SmallArray<TypeBase_*,_16U> local_c8;
  FunctionHandle *pFVar5;
  undefined4 extraout_var_00;
  
  local_c8.allocator = ctx->allocator;
  local_c8.data = local_c8.little;
  local_c8.count = 0;
  local_c8.max = 0x10;
  local_d8.head = (FunctionHandle *)0x0;
  local_d8.tail = (FunctionHandle *)0x0;
  if (parent != (TypeClass *)0x0) {
    do {
      hash = NULLC::GetStringHash(name.begin,name.end);
      NVar11 = DirectChainedMap<FunctionData_*>::first(&parent->methodMap,hash);
      pNVar4 = NVar11.start;
      pNVar10 = NVar11.node;
      if (NVar11.node != (Node *)0x0) {
LAB_001ea753:
        do {
          pFVar1 = *(FunctionData **)(pNVar10 + 8);
          pTVar2 = pFVar1->type;
          pFVar5 = local_d8.head;
          if (local_d8.head != (FunctionHandle *)0x0 && (pTVar2->super_TypeBase).isGeneric == false)
          {
            do {
              if (pFVar5->function->type == pTVar2) {
                pNVar6 = *(Node **)(pNVar10 + 0x10);
                if (pNVar6 == pNVar4) goto LAB_001ea82f;
                iVar3 = *(int *)pNVar10;
                goto LAB_001ea813;
              }
              pFVar5 = pFVar5->next;
            } while (pFVar5 != (FunctionHandle *)0x0);
          }
          if (local_c8.count == local_c8.max) {
            SmallArray<TypeBase_*,_16U>::grow(&local_c8,local_c8.count);
          }
          if (local_c8.data == (TypeBase **)0x0) {
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<TypeBase *, 16>::push_back(const T &) [T = TypeBase *, N = 16]"
                         );
          }
          uVar9 = (ulong)local_c8.count;
          local_c8.count = local_c8.count + 1;
          local_c8.data[uVar9] = &pTVar2->super_TypeBase;
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
          pFVar5 = (FunctionHandle *)CONCAT44(extraout_var,iVar3);
          pFVar5->function = pFVar1;
          pFVar5->next = (FunctionHandle *)0x0;
          pFVar5->listed = false;
          IntrusiveList<FunctionHandle>::push_back(&local_d8,pFVar5);
          pNVar6 = *(Node **)(pNVar10 + 0x10);
          if (pNVar6 == pNVar4) break;
          iVar3 = *(int *)pNVar10;
          while( true ) {
            if (pNVar6 == (Node *)0x0) goto LAB_001ea82f;
            pNVar10 = pNVar6;
            if (*(int *)pNVar6 == iVar3) break;
            pNVar6 = *(Node **)(pNVar6 + 0x10);
            if (pNVar6 == pNVar4) goto LAB_001ea82f;
          }
        } while( true );
      }
LAB_001ea82f:
      parent = parent->baseClass;
    } while (parent != (TypeClass *)0x0);
    if (local_d8.head != (FunctionHandle *)0x0) {
      setTypes.count = local_c8.count;
      setTypes.data = local_c8.data;
      setTypes._12_4_ = 0;
      pTVar7 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
      pEVar8->typeID = 0x27;
      pEVar8->source = source;
      pEVar8->type = &pTVar7->super_TypeBase;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6978;
      pEVar8[1]._vptr_ExprBase = (_func_int **)local_d8.head;
      *(FunctionHandle **)&pEVar8[1].typeID = local_d8.tail;
      pEVar8[1].source = (SynBase *)value;
      goto LAB_001ea8c6;
    }
  }
  if ((TypeStruct *)value->type == ctx->typeAutoRef) {
    anon_unknown.dwarf_1117a3::Stop
              (ctx,source,"ERROR: function \'%.*s\' is undefined in any of existing classes",
               (ulong)(uint)((int)name.end - (int)name.begin),name.begin);
  }
  pEVar8 = (ExprBase *)0x0;
LAB_001ea8c6:
  SmallArray<TypeBase_*,_16U>::~SmallArray(&local_c8);
  return pEVar8;
LAB_001ea813:
  if (pNVar6 == (Node *)0x0) goto LAB_001ea82f;
  pNVar10 = pNVar6;
  if (*(int *)pNVar6 == iVar3) goto LAB_001ea753;
  pNVar6 = *(Node **)(pNVar6 + 0x10);
  if (pNVar6 == pNVar4) goto LAB_001ea82f;
  goto LAB_001ea813;
}

Assistant:

ExprBase* CreateVirtualFunctionSet(ExpressionContext &ctx, SynBase *source, ExprBase *value, InplaceStr name, TypeClass *parent)
{
	SmallArray<TypeBase*, 16> types(ctx.allocator);
	IntrusiveList<FunctionHandle> functions;

	for(TypeClass *curr = parent; curr; curr = curr->baseClass)
	{
		DirectChainedMap<FunctionData*>::NodeIterator it = curr->methodMap.first(name.hash());

		while(it)
		{
			FunctionData *function = it.node->value;

			FunctionHandle *prev = NULL;

			// Pointer to generic types don't stricly match because they might be resolved to different types
			if(!function->type->isGeneric)
			{
				for(FunctionHandle *curr = functions.head; curr; curr = curr->next)
				{
					if(curr->function->type == function->type)
					{
						prev = curr;
						break;
					}
				}
			}

			if(prev)
			{
				it = curr->methodMap.next(it);
				continue;
			}

			types.push_back(function->type);
			functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(function));

			it = curr->methodMap.next(it);
		}
	}

	if(functions.empty())
	{
		if(value->type != ctx.typeAutoRef)
			return NULL;

		Stop(ctx, source, "ERROR: function '%.*s' is undefined in any of existing classes", FMT_ISTR(name));
	}

	TypeFunctionSet *type = ctx.GetFunctionSetType(types);

	return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, functions, value);
}